

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

bool __thiscall Rml::Element::IsPointWithinElement(Element *this,Vector2f point)

{
  Vector2f VVar1;
  Box *this_00;
  int i;
  int index;
  int iVar2;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  Vector2f local_80;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  Vector2f local_58;
  undefined8 uStack_50;
  Vector2f local_48;
  undefined8 uStack_40;
  float local_38;
  float fStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  local_78._8_4_ = in_XMM0_Dc;
  local_78._0_8_ = point;
  local_78._12_4_ = in_XMM0_Dd;
  UpdateAbsoluteOffsetAndRenderBoxData(this);
  local_58 = this->absolute_offset;
  uStack_50 = 0;
  local_68 = (float)local_78._4_4_;
  fStack_64 = (float)local_78._4_4_;
  fStack_60 = (float)local_78._4_4_;
  fStack_5c = (float)local_78._4_4_;
  for (index = 0;
      iVar2 = (int)((ulong)((long)(this->additional_boxes).
                                  super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->additional_boxes).
                                 super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 6), index <= iVar2;
      index = index + 1) {
    local_80.x = 0.0;
    local_80.y = 0.0;
    this_00 = GetBox(this,index,&local_80);
    local_48 = local_80;
    uStack_40 = 0;
    local_38 = local_58.x + local_80.x;
    fStack_34 = local_58.y;
    uStack_30 = (undefined4)uStack_50;
    uStack_2c = uStack_50._4_4_;
    VVar1 = Box::GetSize(this_00,Border);
    if ((((local_38 <= (float)local_78._0_4_) && ((float)local_78._0_4_ <= local_38 + VVar1.x)) &&
        (local_48.y + local_58.y <= local_68)) && (local_68 <= local_48.y + local_58.y + VVar1.y))
    break;
  }
  return index <= iVar2;
}

Assistant:

bool Element::IsPointWithinElement(const Vector2f point)
{
	const Vector2f position = GetAbsoluteOffset(BoxArea::Border);

	for (int i = 0; i < GetNumBoxes(); ++i)
	{
		Vector2f box_offset;
		const Box& box = GetBox(i, box_offset);

		const Vector2f box_position = position + box_offset;
		const Vector2f box_dimensions = box.GetSize(BoxArea::Border);
		if (point.x >= box_position.x && point.x <= (box_position.x + box_dimensions.x) && point.y >= box_position.y &&
			point.y <= (box_position.y + box_dimensions.y))
		{
			return true;
		}
	}

	return false;
}